

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

size_t Output::TraceWithPrefix(Phase phase,char16 *prefix,char16 *form,...)

{
  bool bVar1;
  WCHAR local_448 [4];
  WCHAR prefixValue [512];
  va_list argptr;
  size_t local_28;
  size_t retValue;
  char16 *form_local;
  char16 *prefix_local;
  Phase phase_local;
  
  local_28 = 0;
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,phase);
  if (bVar1) {
    prefixValue[0x1fe] = L'0';
    prefixValue[0x1ff] = L'\0';
    prefixValue[0x1fc] = L'\x18';
    prefixValue[0x1fd] = L'\0';
    _snwprintf_unsafe(local_448,0x200,0xffffffffffffffff,L"%s: %s: ",
                      *(undefined8 *)(Js::PhaseNames + (long)(int)(uint)phase * 8),prefix);
    local_28 = VTrace(L"%s",local_448,form,(__va_list_tag *)(prefixValue + 0x1fc));
  }
  return local_28;
}

Assistant:

size_t __cdecl
Output::TraceWithPrefix(Js::Phase phase, const char16 prefix[], const char16 *form, ...)
{
    size_t retValue = 0;

    if (Js::Configuration::Global.flags.Trace.IsEnabled(phase))
    {
        va_list argptr;
        va_start(argptr, form);
        WCHAR prefixValue[512];
        _snwprintf_s(prefixValue, _countof(prefixValue), _TRUNCATE, _u("%s: %s: "), Js::PhaseNames[static_cast<int>(phase)], prefix);
        retValue += Output::VTrace(_u("%s"), prefixValue, form, argptr);
        va_end(argptr);
    }

    return retValue;
}